

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3SnippetDetails(SnippetIter *pIter,u64 mCovered,int *piToken,int *piScore,u64 *pmCover,
                       u64 *pmHighlight)

{
  ulong uVar1;
  u64 mPos;
  u64 mPhrase;
  int j;
  int iCsr;
  char *pCsr;
  SnippetPhrase *pPhrase;
  u64 mHighlight;
  u64 mCover;
  int local_40;
  int i;
  int iScore;
  int iStart;
  u64 *pmHighlight_local;
  u64 *pmCover_local;
  int *piScore_local;
  int *piToken_local;
  u64 mCovered_local;
  SnippetIter *pIter_local;
  
  i = pIter->iCurrent;
  local_40 = 0;
  mHighlight = 0;
  pPhrase = (SnippetPhrase *)0x0;
  mCover._4_4_ = 0;
  _iScore = pmHighlight;
  pmHighlight_local = pmCover;
  pmCover_local = (u64 *)piScore;
  piScore_local = piToken;
  piToken_local = (int *)mCovered;
  mCovered_local = (u64)pIter;
  do {
    if (*(int *)(mCovered_local + 0x10) <= mCover._4_4_) {
      *piScore_local = i;
      *(int *)pmCover_local = local_40;
      *pmHighlight_local = mHighlight;
      *_iScore = (u64)pPhrase;
      return;
    }
    pCsr = (char *)(*(long *)(mCovered_local + 0x18) + (long)mCover._4_4_ * 0x30);
    if (*(long *)(pCsr + 0x28) != 0) {
      _j = *(char **)(pCsr + 0x28);
      mPhrase._4_4_ = *(int *)(pCsr + 0x20);
      while (mPhrase._4_4_ < i + *(int *)(mCovered_local + 0xc) && i <= mPhrase._4_4_) {
        uVar1 = 1L << ((byte)mCover._4_4_ & 0x3f);
        if (((mHighlight | (ulong)piToken_local) & uVar1) == 0) {
          local_40 = local_40 + 1000;
        }
        else {
          local_40 = local_40 + 1;
        }
        mHighlight = uVar1 | mHighlight;
        for (mPhrase._0_4_ = 0; (int)mPhrase < *(int *)pCsr; mPhrase._0_4_ = (int)mPhrase + 1) {
          pPhrase = (SnippetPhrase *)
                    ((ulong)(1L << ((char)mPhrase._4_4_ - (char)i & 0x3fU)) >>
                     ((byte)(int)mPhrase & 0x3f) | (ulong)pPhrase);
        }
        if (((int)*_j & 0xfeU) == 0) break;
        fts3GetDeltaPosition((char **)&j,(int *)((long)&mPhrase + 4));
      }
    }
    mCover._4_4_ = mCover._4_4_ + 1;
  } while( true );
}

Assistant:

static void fts3SnippetDetails(
  SnippetIter *pIter,             /* Snippet iterator */
  u64 mCovered,                   /* Bitmask of phrases already covered */
  int *piToken,                   /* OUT: First token of proposed snippet */
  int *piScore,                   /* OUT: "Score" for this snippet */
  u64 *pmCover,                   /* OUT: Bitmask of phrases covered */
  u64 *pmHighlight                /* OUT: Bitmask of terms to highlight */
){
  int iStart = pIter->iCurrent;   /* First token of snippet */
  int iScore = 0;                 /* Score of this snippet */
  int i;                          /* Loop counter */
  u64 mCover = 0;                 /* Mask of phrases covered by this snippet */
  u64 mHighlight = 0;             /* Mask of tokens to highlight in snippet */

  for(i=0; i<pIter->nPhrase; i++){
    SnippetPhrase *pPhrase = &pIter->aPhrase[i];
    if( pPhrase->pTail ){
      char *pCsr = pPhrase->pTail;
      int iCsr = pPhrase->iTail;

      while( iCsr<(iStart+pIter->nSnippet) && iCsr>=iStart ){
        int j;
        u64 mPhrase = (u64)1 << i;
        u64 mPos = (u64)1 << (iCsr - iStart);
        assert( iCsr>=iStart && (iCsr - iStart)<=64 );
        assert( i>=0 && i<=64 );
        if( (mCover|mCovered)&mPhrase ){
          iScore++;
        }else{
          iScore += 1000;
        }
        mCover |= mPhrase;

        for(j=0; j<pPhrase->nToken; j++){
          mHighlight |= (mPos>>j);
        }

        if( 0==(*pCsr & 0x0FE) ) break;
        fts3GetDeltaPosition(&pCsr, &iCsr);
      }
    }
  }

  /* Set the output variables before returning. */
  *piToken = iStart;
  *piScore = iScore;
  *pmCover = mCover;
  *pmHighlight = mHighlight;
}